

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QMdiSubWindow * __thiscall
QMdiAreaPrivate::nextVisibleSubWindow
          (QMdiAreaPrivate *this,int increaseFactor,WindowOrder order,int removedIndex,int fromIndex
          )

{
  bool bVar1;
  int candidate;
  qsizetype qVar2;
  const_reference ppQVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QMdiAreaPrivate *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  bool increasing;
  int indexToCurrent;
  QMdiArea *q;
  int index;
  int candidateIndex;
  QMdiSubWindow *current;
  QList<QMdiSubWindow_*> subWindows;
  QMdiSubWindow **in_stack_ffffffffffffff68;
  QListSpecialMethodsBase<QMdiSubWindow_*> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  WindowOrder in_stack_ffffffffffffff84;
  QMdiArea *in_stack_ffffffffffffff88;
  QMdiSubWindow *local_38;
  QMdiSubWindow *local_28;
  QList<QMdiSubWindow_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x6118a8);
  if (bVar1) {
    local_38 = (QMdiSubWindow *)0x0;
    goto LAB_00611b16;
  }
  q_func(in_RDI);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QMdiArea::subWindowList(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  local_28 = (QMdiSubWindow *)0x0;
  if (in_ECX < 0) {
    if (-1 < in_R8D) {
      in_stack_ffffffffffffff88 = (QMdiArea *)(long)in_R8D;
      qVar2 = QList<QMdiSubWindow_*>::size(&local_20);
      if ((long)in_stack_ffffffffffffff88 < qVar2) {
        QList<QPointer<QMdiSubWindow>_>::at
                  ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff70,
                   (qsizetype)in_stack_ffffffffffffff68);
        local_28 = ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x61195e);
        goto LAB_00611976;
      }
    }
    local_28 = QMdiArea::currentSubWindow(in_stack_ffffffffffffff88);
  }
LAB_00611976:
  if (local_28 == (QMdiSubWindow *)0x0) {
    if ((in_ECX < 0) || (in_EDX != 0)) {
      QList<QMdiSubWindow_*>::back((QList<QMdiSubWindow_*> *)0x6119f1);
    }
    else {
      QList<QMdiSubWindow_*>::size(&local_20);
      setIndex((int *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),false);
      QList<QPointer<QMdiSubWindow>_>::at
                ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff70,
                 (qsizetype)in_stack_ffffffffffffff68);
      ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x6119e0);
    }
  }
  qVar2 = QListSpecialMethodsBase<QMdiSubWindow*>::indexOf<QMdiSubWindow*>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x611a0e);
  QList<QMdiSubWindow_*>::size(&local_20);
  setIndex((int *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
           (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),false);
  do {
    QList<QMdiSubWindow_*>::at
              ((QList<QMdiSubWindow_*> *)in_stack_ffffffffffffff70,
               (qsizetype)in_stack_ffffffffffffff68);
    bVar1 = QWidget::isHidden((QWidget *)0x611a75);
    if (!bVar1) break;
    candidate = in_ESI + -1;
    QList<QMdiSubWindow_*>::size(&local_20);
    setIndex((int *)in_stack_ffffffffffffff68,candidate,in_stack_ffffffffffffff78,
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),false);
  } while ((int)qVar2 != -1);
  QList<QMdiSubWindow_*>::at
            ((QList<QMdiSubWindow_*> *)in_stack_ffffffffffffff70,
             (qsizetype)in_stack_ffffffffffffff68);
  bVar1 = QWidget::isHidden((QWidget *)0x611ad6);
  if (bVar1) {
    local_38 = (QMdiSubWindow *)0x0;
  }
  else {
    ppQVar3 = QList<QMdiSubWindow_*>::at
                        ((QList<QMdiSubWindow_*> *)in_stack_ffffffffffffff70,
                         (qsizetype)in_stack_ffffffffffffff68);
    local_38 = *ppQVar3;
  }
  QList<QMdiSubWindow_*>::~QList((QList<QMdiSubWindow_*> *)0x611b16);
LAB_00611b16:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

QMdiSubWindow *QMdiAreaPrivate::nextVisibleSubWindow(int increaseFactor, QMdiArea::WindowOrder order,
                                                     int removedIndex, int fromIndex) const
{
    if (childWindows.isEmpty())
        return nullptr;

    Q_Q(const QMdiArea);
    const QList<QMdiSubWindow *> subWindows = q->subWindowList(order);
    QMdiSubWindow *current = nullptr;

    if (removedIndex < 0) {
        if (fromIndex >= 0 && fromIndex < subWindows.size())
            current = childWindows.at(fromIndex);
        else
            current = q->currentSubWindow();
    }

    // There's no current sub-window (removed or deactivated),
    // so we have to pick the last active or the next in creation order.
    if (!current) {
        if (removedIndex >= 0 && order == QMdiArea::CreationOrder) {
            int candidateIndex = -1;
            setIndex(&candidateIndex, removedIndex, 0, subWindows.size() - 1, true);
            current = childWindows.at(candidateIndex);
        } else {
            current = subWindows.back();
        }
    }
    Q_ASSERT(current);

    // Find the index for the current sub-window in the given activation order
    const int indexToCurrent = subWindows.indexOf(current);
    const bool increasing = increaseFactor > 0;

    // and use that index + increseFactor as a candidate.
    int index = -1;
    setIndex(&index, indexToCurrent + increaseFactor, 0, subWindows.size() - 1, increasing);
    Q_ASSERT(index != -1);

    // Try to find another window if the candidate is hidden.
    while (subWindows.at(index)->isHidden()) {
        setIndex(&index, index + increaseFactor, 0, subWindows.size() - 1, increasing);
        if (index == indexToCurrent)
            break;
    }

    if (!subWindows.at(index)->isHidden())
        return subWindows.at(index);
    return nullptr;
}